

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

cram_index * cram_index_query(cram_fd *fd,int refid,int pos,cram_index *from)

{
  uint uVar1;
  uint uVar2;
  cram_index *pcVar3;
  ulong uVar4;
  cram_index *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  if ((refid < -1) || (uVar2 = refid + 1, fd->index_sz <= (int)uVar2)) {
    return (cram_index *)0x0;
  }
  uVar1 = fd->index[uVar2].nslice;
  uVar6 = uVar1 - 1;
  pcVar5 = fd->index + uVar2;
  if (from != (cram_index *)0x0) {
    pcVar5 = from;
  }
  if (uVar1 < 3) {
    pcVar3 = pcVar5->e;
    uVar4 = 0;
  }
  else {
    uVar2 = (int)uVar6 / 2;
    pcVar3 = pcVar5->e;
    uVar4 = 0;
    do {
      if ((pcVar3[(int)uVar2].refid <= refid) &&
         ((pcVar3[(int)uVar2].refid < refid || (pcVar3[(int)uVar2].start < pos)))) {
        uVar4 = (ulong)uVar2;
        uVar2 = uVar6;
      }
      uVar6 = uVar2;
      iVar8 = uVar6 - (int)uVar4;
      uVar2 = iVar8 / 2 + (int)uVar4;
    } while (2 < iVar8 + 1U);
  }
  if ((pcVar3[(int)uVar6].start < pos) && (pcVar3[(int)uVar6].refid == refid)) {
    uVar4 = (ulong)uVar6;
  }
  iVar8 = (int)uVar4;
  if (0 < iVar8) {
    do {
      iVar8 = (int)uVar4;
      if (pcVar3[uVar4 - 1].end < pos) goto LAB_00129f93;
      uVar4 = (ulong)(iVar8 - 1);
    } while (1 < iVar8);
    iVar8 = 0;
  }
LAB_00129f93:
  iVar7 = iVar8 + 1;
  if (((iVar7 < pcVar5->nslice) && (pcVar3[iVar7].start == pos)) && (pcVar3[iVar7].refid == refid))
  {
    iVar8 = iVar7;
  }
  return pcVar3 + iVar8;
}

Assistant:

cram_index *cram_index_query(cram_fd *fd, int refid, int pos, 
			     cram_index *from) {
    int i, j, k;
    cram_index *e;

    if (refid+1 < 0 || refid+1 >= fd->index_sz)
	return NULL;

    i = 0, j = fd->index[refid+1].nslice-1;

    if (!from)
	from = &fd->index[refid+1];

    for (k = j/2; k != i; k = (j-i)/2 + i) {
	if (from->e[k].refid > refid) {
	    j = k;
	    continue;
	}

	if (from->e[k].refid < refid) {
	    i = k;
	    continue;
	}

	if (from->e[k].start >= pos) {
	    j = k;
	    continue;
	}

	if (from->e[k].start < pos) {
	    i = k;
	    continue;
	}
    }
    // i==j or i==j-1. Check if j is better.
    if (from->e[j].start < pos && from->e[j].refid == refid)
	i = j;

    /* The above found *a* bin overlapping, but not necessarily the first */
    while (i > 0 && from->e[i-1].end >= pos)
	i--;

    /* Special case for matching a start pos */
    if (i+1 < from->nslice &&
	from->e[i+1].start == pos &&
	from->e[i+1].refid == refid)
	i++;

    e = &from->e[i];

    return e;
}